

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  undefined8 *puVar1;
  size_t sVar2;
  Builder builder_00;
  Builder builder_01;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  ArrayPtr<const_capnp::word> *pAVar3;
  SegmentInit *pSVar4;
  long lVar5;
  void *count;
  ArrayPtr<const_capnp::word> *iter;
  long lVar6;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar7;
  Reader value;
  Fault f;
  char *local_2b0;
  int local_294;
  ulong local_290;
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  Builder local_270;
  Builder local_248;
  Builder local_220;
  TestInitMessageBuilder builder2;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,1,FIXED_SIZE);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_220,&builder.super_MessageBuilder);
  builder_00._builder.capTable = local_220._builder.capTable;
  builder_00._builder.segment = local_220._builder.segment;
  builder_00._builder.data = local_220._builder.data;
  builder_00._builder.pointers = local_220._builder.pointers;
  builder_00._builder.dataSize = local_220._builder.dataSize;
  builder_00._builder.pointerCount = local_220._builder.pointerCount;
  builder_00._builder._38_2_ = local_220._builder._38_2_;
  initTestMessage(builder_00);
  AVar7 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  count = (void *)AVar7.size_;
  pAVar3 = AVar7.ptr;
  builder2.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)CONCAT44(builder2.super_MessageBuilder._vptr_MessageBuilder._4_4_,1);
  builder2.super_MessageBuilder.arenaSpace[1] = anon_var_dwarf_b81a;
  builder2.super_MessageBuilder.arenaSpace[2] = &DAT_00000005;
  builder2.super_MessageBuilder.arenaSpace[3]._0_1_ = count != (void *)0x1;
  builder2.super_MessageBuilder.arenaSpace[0] = count;
  if ((bool)builder2.super_MessageBuilder.arenaSpace[3]._0_1_) {
    pSVar4 = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::MessageBuilder::SegmentInit>
                       ((size_t)count);
    builder2.super_MessageBuilder.arenaSpace[2] = &kj::_::HeapArrayDisposer::instance;
    lVar5 = 0;
    for (lVar6 = (long)count << 4; lVar6 != 0; lVar6 = lVar6 + -0x10) {
      puVar1 = (undefined8 *)((long)&(pSVar4->space).ptr + lVar5);
      sVar2 = pAVar3->size_;
      *puVar1 = pAVar3->ptr;
      puVar1[1] = sVar2;
      puVar1[2] = sVar2;
      pAVar3 = pAVar3 + 1;
      lVar5 = lVar5 + 0x18;
    }
    segInits.size_ = lVar5 / 0x18;
    segInits.ptr._0_4_ = SUB84(pSVar4,0);
    segInits.ptr._4_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    segInits.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder2.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)0x0;
    builder2.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    builder2.super_MessageBuilder.arenaSpace[1] = (void *)0x0;
    kj::ArrayBuilder<capnp::MessageBuilder::SegmentInit>::dispose
              ((ArrayBuilder<capnp::MessageBuilder::SegmentInit> *)&builder2);
    segments.ptr._4_4_ = segInits.ptr._4_4_;
    segments.ptr._0_4_ = segInits.ptr._0_4_;
    segments.size_ = segInits.size_;
    TestInitMessageBuilder::TestInitMessageBuilder(&builder2,segments);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_248,&builder2.super_MessageBuilder);
    builder_01._builder.capTable = local_248._builder.capTable;
    builder_01._builder.segment = local_248._builder.segment;
    builder_01._builder.data = local_248._builder.data;
    builder_01._builder.pointers = local_248._builder.pointers;
    builder_01._builder.dataSize = local_248._builder.dataSize;
    builder_01._builder.pointerCount = local_248._builder.pointerCount;
    builder_01._builder._38_2_ = local_248._builder._38_2_;
    checkTestMessage(builder_01);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              ((Builder *)&f,&builder2.super_MessageBuilder);
    local_2b0[8] = -0x47;
    local_2b0[9] = -0x1f;
    local_2b0[10] = '\x01';
    local_2b0[0xb] = '\0';
    local_2b0[0xc] = '\0';
    local_2b0[0xd] = '\0';
    local_2b0[0xe] = '\0';
    local_2b0[0xf] = '\0';
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_270,&builder.super_MessageBuilder);
    f.exception._0_4_ = 0x1e1b9;
    if (kj::_::Debug::minSeverity < 3 && *(long *)((long)local_270._builder.data + 8) != 0x1e1b9) {
      local_294 = 0x1e1b9;
      MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                (&local_270,&builder.super_MessageBuilder);
      local_290 = *(ulong *)((long)local_270._builder.data + 8);
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", _kjCondition, 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
                 ,(char (*) [79])
                  "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
                 (DebugComparison<int,_long> *)&f,&local_294,(long *)&local_290);
    }
    f.exception._0_4_ = 0;
    if ((builder2.allocations.builder.pos != builder2.allocations.builder.ptr) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_290 = local_290 & 0xffffffff00000000;
      local_270._builder.segment =
           (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr) / 0x18
           );
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", _kjCondition, 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",
                 (DebugComparison<int,_unsigned_long> *)&f,(int *)&local_290,
                 (unsigned_long *)&local_270);
    }
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              ((Builder *)&f,&builder2.super_MessageBuilder);
    value.super_StringPtr.content.size_ = 10;
    value.super_StringPtr.content.ptr = "foobarbaz";
    capnproto_test::capnp::test::TestAllTypes::Builder::setTextField((Builder *)&f,value);
    f.exception._0_4_ = 1;
    if (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr != 0x18) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_290 = CONCAT44(local_290._4_4_,1);
      local_270._builder.segment =
           (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr) / 0x18
           );
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x78,ERROR,
                 "\"failed: expected \" \"(1) == (builder2.allocations.size())\", _kjCondition, 1, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",
                 (DebugComparison<int,_unsigned_long> *)&f,(int *)&local_290,
                 (unsigned_long *)&local_270);
    }
    TestInitMessageBuilder::~TestInitMessageBuilder(&builder2);
    kj::Array<capnp::MessageBuilder::SegmentInit>::~Array(&segInits);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  segInits.ptr._0_4_ = 1;
  local_270._builder.segment = (SegmentBuilder *)0x1;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
             ,0x67,FAILED,"(1) != (segs.size())","_kjCondition,1, segs.size()",
             (DebugComparison<int,_unsigned_long> *)&builder2,(int *)&segInits,
             (unsigned_long *)&local_270);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}